

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_asof_join.cpp
# Opt level: O2

idx_t __thiscall
duckdb::AsOfLocalSourceState::BeginRightScan(AsOfLocalSourceState *this,idx_t hash_bin_p)

{
  HashGroupPtr *this_00;
  pointer __p;
  __uniq_ptr_impl<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
  *__u;
  pointer pPVar1;
  pointer pGVar2;
  type args;
  reference pvVar3;
  pointer this_01;
  idx_t iVar4;
  pointer local_20;
  
  this->hash_bin = hash_bin_p;
  __u = (__uniq_ptr_impl<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
         *)vector<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>,_true>
           ::get<true>(&(this->gsource->gsink->rhs_sink).hash_groups,hash_bin_p);
  this_00 = &this->hash_group;
  ::std::
  __uniq_ptr_impl<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
  ::operator=((__uniq_ptr_impl<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
               *)this_00,__u);
  pPVar1 = unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>
           ::operator->(this_00);
  pGVar2 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>::
           operator->(&pPVar1->global_sort);
  if ((pGVar2->sorted_blocks).
      super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (pGVar2->sorted_blocks).
      super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    iVar4 = 0;
  }
  else {
    pPVar1 = unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>
             ::operator->(this_00);
    args = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>::
           operator*(&pPVar1->global_sort);
    make_uniq<duckdb::PayloadScanner,duckdb::GlobalSortState&>((duckdb *)&local_20,args);
    __p = local_20;
    local_20 = (pointer)0x0;
    ::std::__uniq_ptr_impl<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_>::
    reset((__uniq_ptr_impl<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_> *)
          &this->scanner,__p);
    ::std::unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_>::
    ~unique_ptr((unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_> *)
                &local_20);
    pvVar3 = vector<duckdb::OuterJoinMarker,_true>::get<true>
                       (&this->gsource->gsink->right_outers,this->hash_bin);
    this->found_match =
         (pvVar3->found_match).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
         super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
         super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
         super__Head_base<0UL,_bool_*,_false>._M_head_impl;
    this_01 = unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>,_true>
              ::operator->(&this->scanner);
    iVar4 = PayloadScanner::Remaining(this_01);
  }
  return iVar4;
}

Assistant:

idx_t AsOfLocalSourceState::BeginRightScan(const idx_t hash_bin_p) {
	hash_bin = hash_bin_p;

	hash_group = std::move(gsource.gsink.rhs_sink.hash_groups[hash_bin]);
	if (hash_group->global_sort->sorted_blocks.empty()) {
		return 0;
	}
	scanner = make_uniq<PayloadScanner>(*hash_group->global_sort);
	found_match = gsource.gsink.right_outers[hash_bin].GetMatches();

	return scanner->Remaining();
}